

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec.cpp
# Opt level: O0

int __thiscall DSDcc::Golay_20_8::init(Golay_20_8 *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  char cVar2;
  void *pvVar3;
  uchar uVar4;
  uchar uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int syndromeIP3;
  int ip3;
  int syndromeIP2_1;
  int ip2_1;
  int syndromeIP1_1;
  int ip1_1;
  int syndromeIP2;
  int ip2;
  int syndromeIP1;
  int ip1;
  int ir_2;
  int syndromeI;
  int syndromeIP;
  int ip;
  int ir_1;
  int syndromeI_1;
  int ir;
  int syndromeI_2;
  int i3;
  int i2;
  int i1;
  int local_58;
  uint local_50;
  uint local_48;
  int local_40;
  int local_38;
  int local_34;
  uint local_30;
  int local_28;
  int local_24;
  uint local_20;
  int local_1c;
  int local_18;
  int local_14;
  uint local_10;
  uint local_c;
  
  pvVar3 = memset(this,0xff,0x3000);
  local_c = 0;
  while (uVar6 = local_c, (int)local_c < 8) {
    while( true ) {
      local_10 = uVar6 + 1;
      uVar4 = (uchar)local_c;
      if (7 < (int)local_10) break;
      for (local_14 = uVar6 + 2; uVar5 = (uchar)local_10, local_14 < 8; local_14 = local_14 + 1) {
        local_18 = 0;
        for (local_1c = 0; local_1c < 0xc; local_1c = local_1c + 1) {
          local_18 = (((uint)(byte)m_H[(int)(local_1c * 0x14 + local_c)] +
                       (uint)(byte)m_H[(int)(local_1c * 0x14 + local_10)] +
                      (uint)(byte)m_H[local_1c * 0x14 + local_14]) % 2 <<
                     (0xbU - (char)local_1c & 0x1f)) + local_18;
        }
        this->m_corr[local_18][0] = uVar4;
        this->m_corr[local_18][1] = uVar5;
        this->m_corr[local_18][2] = (uchar)local_14;
      }
      local_20 = 0;
      for (local_24 = 0; local_24 < 0xc; local_24 = local_24 + 1) {
        local_20 = (((uint)(byte)m_H[(int)(local_24 * 0x14 + local_c)] +
                    (uint)(byte)m_H[(int)(local_24 * 0x14 + local_10)]) % 2 <<
                   (0xbU - (char)local_24 & 0x1f)) + local_20;
      }
      this->m_corr[(int)local_20][0] = uVar4;
      this->m_corr[(int)local_20][1] = uVar5;
      for (local_28 = 0; uVar6 = local_10, local_28 < 0xc; local_28 = local_28 + 1) {
        uVar6 = local_20 ^ 1 << (0xbU - (char)local_28 & 0x1f);
        this->m_corr[(int)uVar6][0] = uVar4;
        this->m_corr[(int)uVar6][1] = uVar5;
        this->m_corr[(int)uVar6][2] = (char)local_28 + '\b';
      }
    }
    local_30 = 0;
    for (local_34 = 0; local_34 < 0xc; local_34 = local_34 + 1) {
      local_30 = ((uint)(byte)m_H[(int)(local_34 * 0x14 + local_c)] <<
                 (0xbU - (char)local_34 & 0x1f)) + local_30;
    }
    this->m_corr[(int)local_30][0] = uVar4;
    for (local_38 = 0; local_38 < 0xc; local_38 = local_38 + 1) {
      cVar1 = (char)local_38;
      uVar6 = local_30 ^ 1 << (0xbU - cVar1 & 0x1f);
      this->m_corr[(int)uVar6][0] = uVar4;
      this->m_corr[(int)uVar6][1] = cVar1 + '\b';
      local_40 = local_38;
      while (local_40 = local_40 + 1, local_40 < 0xc) {
        uVar7 = uVar6 ^ 1 << (0xbU - (char)local_40 & 0x1f);
        this->m_corr[(int)uVar7][0] = uVar4;
        this->m_corr[(int)uVar7][1] = cVar1 + '\b';
        this->m_corr[(int)uVar7][2] = (char)local_40 + '\b';
      }
    }
    local_c = local_c + 1;
    pvVar3 = (void *)(ulong)local_c;
  }
  local_48 = 0;
  while ((int)local_48 < 0xc) {
    cVar1 = (char)local_48;
    uVar7 = 1 << (0xbU - cVar1 & 0x1f);
    this->m_corr[(int)uVar7][0] = cVar1 + '\b';
    uVar6 = local_48;
    while (local_50 = uVar6 + 1, (int)local_50 < 0xc) {
      cVar2 = (char)local_50;
      uVar8 = uVar7 ^ 1 << (0xbU - cVar2 & 0x1f);
      this->m_corr[(int)uVar8][0] = cVar1 + '\b';
      this->m_corr[(int)uVar8][1] = cVar2 + '\b';
      for (local_58 = uVar6 + 2; uVar6 = local_50, local_58 < 0xc; local_58 = local_58 + 1) {
        uVar6 = uVar8 ^ 1 << (0xbU - (char)local_58 & 0x1f);
        this->m_corr[(int)uVar6][0] = cVar1 + '\b';
        this->m_corr[(int)uVar6][1] = cVar2 + '\b';
        this->m_corr[(int)uVar6][2] = (char)local_58 + '\b';
      }
    }
    local_48 = local_48 + 1;
    pvVar3 = (void *)(ulong)local_48;
  }
  return (int)pvVar3;
}

Assistant:

void Golay_20_8::init()
{
    memset (m_corr, 0xFF, 3*4096);

    for (int i1 = 0; i1 < 8; i1++)
    {
        for (int i2 = i1+1; i2 < 8; i2++)
        {
            for (int i3 = i2+1; i3 < 8; i3++)
            {
                // 3 bit patterns
                int syndromeI = 0;

                for (int ir = 0; ir < 12; ir++)
                {
                    syndromeI += ((m_H[20*ir + i1] +  m_H[20*ir + i2] +  m_H[20*ir + i3]) % 2) << (11-ir);
                }

                m_corr[syndromeI][0] = i1;
                m_corr[syndromeI][1] = i2;
                m_corr[syndromeI][2] = i3;
            }

            // 2 bit patterns
            int syndromeI = 0;

            for (int ir = 0; ir < 12; ir++)
            {
                syndromeI += ((m_H[20*ir + i1] +  m_H[20*ir + i2]) % 2) << (11-ir);
            }

            m_corr[syndromeI][0] = i1;
            m_corr[syndromeI][1] = i2;

            // 1 possible bit flip left in the parity part
            for (int ip = 0; ip < 12; ip++)
            {
                int syndromeIP = syndromeI ^ (1 << (11-ip));
                m_corr[syndromeIP][0] = i1;
                m_corr[syndromeIP][1] = i2;
                m_corr[syndromeIP][2] = 8 + ip;
            }
        }

        // single bit patterns
        int syndromeI = 0;

        for (int ir = 0; ir < 12; ir++)
        {
            syndromeI += m_H[20*ir + i1] << (11-ir);

        }

        m_corr[syndromeI][0] = i1;

        for (int ip1 = 0; ip1 < 12; ip1++) // 1 more bit flip in parity
        {
            int syndromeIP1 = syndromeI ^ (1 << (11-ip1));
            m_corr[syndromeIP1][0] = i1;
            m_corr[syndromeIP1][1] = 8 + ip1;

            for (int ip2 = ip1+1; ip2 < 12; ip2++) // 1 more bit flip in parity
            {
                int syndromeIP2 = syndromeIP1 ^ (1 << (11-ip2));
                m_corr[syndromeIP2][0] = i1;
                m_corr[syndromeIP2][1] = 8 + ip1;
                m_corr[syndromeIP2][2] = 8 + ip2;
            }
        }
    }

    // no bit patterns (in message) -> all in parity
    for (int ip1 = 0; ip1 < 12; ip1++) // 1 bit flip in parity
    {
        int syndromeIP1 =  (1 << (11-ip1));
        m_corr[syndromeIP1][0] = 8 + ip1;

        for (int ip2 = ip1+1; ip2 < 12; ip2++) // 1 more bit flip in parity
        {
            int syndromeIP2 = syndromeIP1 ^ (1 << (11-ip2));
            m_corr[syndromeIP2][0] = 8 + ip1;
            m_corr[syndromeIP2][1] = 8 + ip2;

            for (int ip3 = ip2+1; ip3 < 12; ip3++) // 1 more bit flip in parity
            {
                int syndromeIP3 = syndromeIP2 ^ (1 << (11-ip3));
                m_corr[syndromeIP3][0] = 8 + ip1;
                m_corr[syndromeIP3][1] = 8 + ip2;
                m_corr[syndromeIP3][2] = 8 + ip3;
            }
        }
    }
}